

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor
          (CopyingOutputStreamAdaptor *this,CopyingOutputStream *copying_stream,int block_size)

{
  int local_44;
  int block_size_local;
  CopyingOutputStream *copying_stream_local;
  CopyingOutputStreamAdaptor *this_local;
  
  ZeroCopyOutputStream::ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CopyingOutputStreamAdaptor_00412c70;
  this->copying_stream_ = copying_stream;
  this->owns_copying_stream_ = false;
  this->failed_ = false;
  this->position_ = 0;
  internal::scoped_array<unsigned_char>::scoped_array(&this->buffer_,(uchar *)0x0);
  local_44 = block_size;
  if (block_size < 1) {
    local_44 = 0x2000;
  }
  this->buffer_size_ = local_44;
  this->buffer_used_ = 0;
  return;
}

Assistant:

CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor(
    CopyingOutputStream* copying_stream, int block_size)
  : copying_stream_(copying_stream),
    owns_copying_stream_(false),
    failed_(false),
    position_(0),
    buffer_size_(block_size > 0 ? block_size : kDefaultBlockSize),
    buffer_used_(0) {
}